

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

nh_bool get_option_value(win_menu *mdat,wchar_t idx)

{
  undefined4 uVar1;
  nh_listitem *pnVar2;
  nh_autopickup_rules *pnVar3;
  char cVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  long *plVar9;
  void *pvVar10;
  size_t sVar11;
  wchar_t *results;
  nh_menuitem_conflict *pnVar12;
  nh_menuitem_conflict *pnVar13;
  int iVar14;
  ulong uVar15;
  char **ppcVar16;
  undefined1 *puVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  char *pcVar21;
  ulong uVar22;
  undefined8 *puVar23;
  char *pcVar24;
  nh_menuitem_conflict *pnVar25;
  int iVar26;
  char *pcVar27;
  char *pcVar28;
  long lVar29;
  ulong uVar30;
  nh_option_desc *pnVar31;
  ulong uVar32;
  long lVar33;
  nh_menuitem *_item_;
  long lVar34;
  bool bVar35;
  byte bVar36;
  wchar_t selected [1];
  wchar_t selected_1 [1];
  wchar_t selected_2 [1];
  nh_optvalue value;
  nh_menuitem *_item__5;
  nh_menuitem *_item__2;
  char query [256];
  char query_2 [256];
  char strbuf [256];
  char buf [256];
  wchar_t local_1efc;
  nh_menuitem_conflict *local_1ef8;
  nh_option_desc *local_1ef0;
  char *local_1ee8;
  nh_menuitem_conflict *local_1ee0;
  wchar_t local_1ed8;
  wchar_t local_1ed4;
  char *local_1ed0;
  char *local_1ec8;
  ulong local_1ec0;
  char *local_1eb8;
  nh_menuitem_conflict *local_1eb0;
  undefined1 *local_1ea8;
  char *local_1ea0;
  char *local_1e98;
  wchar_t local_1e8c;
  long local_1e88;
  char *local_1e80;
  nh_menuitem_conflict *local_1e78;
  char *local_1e70;
  ulong local_1e68;
  char acStack_1e60 [248];
  char local_1d68 [4];
  undefined2 auStack_1d64 [2];
  undefined4 auStack_1d60 [62];
  char local_1c68 [256];
  char local_1b68 [256];
  nh_menuitem_conflict local_1a68 [25];
  
  iVar18 = settings.optstyle;
  bVar36 = 0;
  lVar29 = (long)idx * 0x10c;
  wVar6 = mdat->items[idx].id;
  iVar26 = wVar6 >> 10;
  if (3 < iVar26 - 1U) {
    return '\0';
  }
  switch(iVar26) {
  case 2:
    break;
  case 3:
    break;
  case 4:
    pnVar31 = curses_options;
    goto LAB_001101a3;
  }
  pnVar31 = (nh_option_desc *)nh_get_options();
LAB_001101a3:
  uVar30 = (ulong)(uint)((wVar6 & 0x1ffU) * 0x30);
  local_1ed0 = local_1b68;
  uVar20 = *(uint *)((long)&pnVar31->type + uVar30);
  if (5 < uVar20) {
    if (uVar20 != 1000) {
      return '\0';
    }
    show_keymap_menu('\0');
    return '\0';
  }
  pnVar31 = (nh_option_desc *)((long)&pnVar31->name + uVar30);
  local_1ef0 = pnVar31;
  switch(uVar20) {
  case 0:
    local_1ef8 = (nh_menuitem_conflict *)lVar29;
    pnVar12 = (nh_menuitem_conflict *)malloc(0x430);
    pnVar12->id = L'\0';
    pnVar12->role = MI_TEXT;
    pnVar12->accel = '\0';
    pnVar12->group_accel = '\0';
    pnVar12->selected = '\0';
    strcpy(pnVar12->caption,local_1ef0->helptxt);
    pnVar12[1].accel = '\0';
    pnVar12[1].group_accel = '\0';
    pnVar12[1].selected = '\0';
    pnVar12[1].id = L'\0';
    pnVar12[1].role = MI_TEXT;
    pnVar12[1].caption[0] = '\0';
    pnVar12[2].id = L'\x01';
    pnVar12[2].role = MI_NORMAL;
    pnVar12[2].accel = 't';
    pnVar12[2].group_accel = '\0';
    pnVar12[2].selected = '\0';
    bVar35 = (local_1ef0->value).b == '\0';
    pcVar21 = "true (set)";
    if (bVar35) {
      pcVar21 = "true";
    }
    pcVar27 = "false";
    if (bVar35) {
      pcVar27 = "false (set)";
    }
    strcpy(pnVar12[2].caption,pcVar21);
    pnVar31 = local_1ef0;
    pnVar12[3].id = L'\x02';
    pnVar12[3].role = MI_NORMAL;
    pnVar12[3].accel = 'f';
    pnVar12[3].group_accel = '\0';
    pnVar12[3].selected = '\0';
    strcpy(pnVar12[3].caption,pcVar27);
    wVar6 = curses_display_menu(pnVar12,L'\x04',pnVar31->name,L'\x01',&local_1a68[0].id);
    free(pnVar12);
    local_1ed0 = (char *)CONCAT71(local_1ed0._1_7_,(pnVar31->value).b);
    if (wVar6 == L'\x01') {
      local_1ed0 = (char *)CONCAT71(local_1ed0._1_7_,local_1a68[0].id == L'\x01');
    }
    break;
  case 1:
    local_1ef8 = (nh_menuitem_conflict *)lVar29;
    sprintf((char *)&local_1e68,"New value for %s (number from %d to %d)",pnVar31->name,
            (ulong)(uint)(pnVar31->field_4).i.min,(ulong)(uint)(pnVar31->field_4).i.max);
    sprintf((char *)local_1a68,"%d",local_1b68);
    curses_getline((char *)&local_1e68,(char *)local_1a68);
    if ((char)local_1a68[0].id == '\x1b') {
      return '\0';
    }
    __isoc99_sscanf(local_1a68,"%d",&local_1ed0);
    break;
  case 2:
    local_1ee0 = (nh_menuitem_conflict *)CONCAT44(local_1ee0._4_4_,iVar18);
    local_1ef8 = (nh_menuitem_conflict *)lVar29;
    pnVar12 = (nh_menuitem_conflict *)malloc(0xa78);
    pnVar12->id = L'\0';
    pnVar12->role = MI_TEXT;
    pnVar12->accel = '\0';
    pnVar12->group_accel = '\0';
    pnVar12->selected = '\0';
    strcpy(pnVar12->caption,local_1ef0->helptxt);
    pnVar12[1].accel = '\0';
    pnVar12[1].group_accel = '\0';
    pnVar12[1].selected = '\0';
    pnVar12[1].id = L'\0';
    pnVar12[1].role = MI_TEXT;
    pnVar12[1].caption[0] = '\0';
    if ((local_1ef0->field_4).e.numchoices < 1) {
      uVar30 = 2;
    }
    else {
      iVar18 = 10;
      uVar30 = 2;
      lVar33 = 8;
      lVar29 = 0x322;
      do {
        pnVar2 = (local_1ef0->field_4).e.choices;
        pnVar13 = *(nh_menuitem_conflict **)((long)&pnVar2->id + lVar33);
        if ((local_1ef0->value).i == *(int *)((long)pnVar2 + lVar33 + -8)) {
          snprintf((char *)local_1a68,0x80,"%s (set)",pnVar13);
          pnVar13 = local_1a68;
        }
        if ((long)iVar18 <= (long)uVar30) {
          iVar18 = iVar18 * 2;
          pnVar12 = (nh_menuitem_conflict *)realloc(pnVar12,(long)iVar18 * 0x10c);
        }
        lVar34 = uVar30 - 1;
        pcVar21 = pnVar12->caption + lVar29 + -8;
        *(int *)(pcVar21 + -0x10a) = (int)lVar34;
        *(undefined4 *)(pcVar21 + -0x106) = 1;
        *(undefined2 *)(pcVar21 + -2) = MI_TEXT >> 0x10;
        *pcVar21 = '\0';
        strcpy(pcVar21 + -0x102,(char *)pnVar13);
        uVar30 = uVar30 + 1;
        lVar33 = lVar33 + 0x10;
        lVar29 = lVar29 + 0x10c;
      } while (lVar34 < (local_1ef0->field_4).e.numchoices);
    }
    pnVar31 = local_1ef0;
    results = (wchar_t *)malloc((uVar30 & 0xffffffff) << 2);
    wVar6 = curses_display_menu(pnVar12,(wchar_t)uVar30,pnVar31->name,L'\x01',results);
    free(pnVar12);
    iVar18 = (pnVar31->value).i;
    if (wVar6 == L'\x01') {
      iVar18 = (pnVar31->field_4).e.choices[(long)*results + -1].id;
    }
    local_1ed0 = (char *)CONCAT44(local_1ed0._4_4_,iVar18);
    free(results);
    iVar18 = (int)local_1ee0;
    break;
  case 3:
    local_1ef8 = (nh_menuitem_conflict *)lVar29;
    sprintf((char *)&local_1e68,"New value for %s (text)",pnVar31->name);
    curses_getline((char *)&local_1e68,local_1b68);
    if (local_1b68[0] == '\x1b') {
      return '\0';
    }
    break;
  case 4:
    plVar9 = (long *)malloc(0x10);
    *(undefined4 *)(plVar9 + 1) = 0;
    *plVar9 = 0;
    pnVar3 = (pnVar31->value).ar;
    if (pnVar3 == (nh_autopickup_rules *)0x0) {
      iVar18 = 4;
    }
    else {
      iVar18 = pnVar3->num_rules;
      *(int *)(plVar9 + 1) = iVar18;
      pvVar10 = malloc((long)(iVar18 * 0x34));
      *plVar9 = (long)pvVar10;
      memcpy(pvVar10,pnVar3->rules,(long)(iVar18 * 0x34));
      iVar18 = iVar18 + 4;
    }
    pnVar12 = (nh_menuitem_conflict *)malloc((long)iVar18 * 0x10c);
    local_1efc = L'\0';
    local_1ee8 = (char *)plVar9;
LAB_00110627:
    do {
      plVar9 = (long *)local_1ee8;
      if (iVar18 < 1) {
        iVar18 = iVar18 * 2;
        pnVar12 = (nh_menuitem_conflict *)realloc(pnVar12,(long)iVar18 * 0x10c);
      }
      pnVar12->id = L'\0';
      pnVar12->role = MI_HEADING;
      pnVar12->accel = '\0';
      pnVar12->group_accel = '\0';
      pnVar12->selected = '\0';
      builtin_strncpy(pnVar12->caption,"Pos\tRule\tAction",0x10);
      if ((int)*(long *)((char *)plVar9 + 1) < 1) {
        uVar30 = 1;
      }
      else {
        uVar30 = 1;
        uVar32 = 0;
        local_1ef8 = pnVar12;
        do {
          lVar33 = *plVar9;
          lVar34 = uVar32 * 0x34;
          lVar29 = lVar33 + lVar34;
          uVar32 = uVar32 + 1;
          sprintf(local_1d68,"%2d.\tIF ",uVar32 & 0xffffffff);
          cVar4 = *(char *)(lVar33 + lVar34);
          if (cVar4 != '\0') {
            sVar11 = strlen(local_1d68);
            sprintf(local_1d68 + sVar11,"name matches \"%s\"",lVar29);
          }
          if (*(int *)(lVar29 + 0x28) == 0x61) {
            uVar20 = *(uint *)(lVar29 + 0x2c);
            if (uVar20 == 4) {
              if (cVar4 == '\0') {
                sprintf(local_1d68,"%2d.\teverything",uVar32 & 0xffffffff);
              }
            }
            else {
              if (cVar4 != '\0') goto LAB_001107c2;
LAB_001107df:
              sVar11 = strlen(local_1d68);
              sprintf(local_1d68 + sVar11,"beatitude is %s",bucnames[uVar20]);
            }
          }
          else {
            uVar15 = (ulong)(local_1ef0->field_4).e.numchoices;
            if ((long)uVar15 < 1) {
              pcVar21 = (char *)0x0;
            }
            else {
              ppcVar16 = &((local_1ef0->field_4).e.choices)->caption;
              uVar22 = 1;
              do {
                if (((nh_listitem *)(ppcVar16 + -1))->id == *(int *)(lVar29 + 0x28)) {
                  pcVar21 = *ppcVar16;
                }
                else {
                  pcVar21 = (char *)0x0;
                }
                if (uVar15 <= uVar22) break;
                uVar22 = uVar22 + 1;
                ppcVar16 = ppcVar16 + 2;
              } while (pcVar21 == (char *)0x0);
            }
            if (cVar4 != '\0') {
              sVar11 = strlen(local_1d68);
              builtin_strncpy(local_1d68 + sVar11," AND",4);
              *(undefined2 *)((long)auStack_1d64 + sVar11) = 0x20;
            }
            sVar11 = strlen(local_1d68);
            sprintf(local_1d68 + sVar11,"type is \"%s\"",pcVar21);
            uVar20 = *(uint *)(lVar29 + 0x2c);
            if (uVar20 != 4) {
LAB_001107c2:
              sVar11 = strlen(local_1d68);
              builtin_strncpy(local_1d68 + sVar11," AND",4);
              *(undefined2 *)((long)auStack_1d64 + sVar11) = 0x20;
              goto LAB_001107df;
            }
          }
          iVar26 = *(int *)(lVar29 + 0x30);
          sVar11 = strlen(local_1d68);
          plVar9 = (long *)local_1ee8;
          if (iVar26 == 0) {
            builtin_strncpy(local_1d68 + sVar11,":\t< GRAB",8);
            *(undefined1 *)((long)auStack_1d60 + sVar11) = 0;
          }
          else {
            builtin_strncpy(local_1d68 + sVar11,":\t  LEAV",8);
            *(undefined4 *)((long)auStack_1d60 + sVar11) = 0x3e2045;
          }
          if ((long)iVar18 <= (long)uVar30) {
            iVar18 = iVar18 * 2;
            local_1ef8 = (nh_menuitem_conflict *)realloc(local_1ef8,(long)iVar18 * 0x10c);
          }
          pnVar12 = local_1ef8 + uVar30;
          pnVar12->id = (wchar_t)uVar32;
          pnVar12->role = MI_NORMAL;
          pnVar12->accel = '\0';
          pnVar12->group_accel = '\0';
          pnVar12->selected = '\0';
          strcpy(pnVar12->caption,local_1d68);
          uVar30 = uVar30 + 1;
          pnVar12 = local_1ef8;
        } while ((long)uVar32 < (long)(int)*(long *)((char *)plVar9 + 1));
      }
      iVar26 = (int)uVar30;
      if (iVar18 <= iVar26) {
        iVar18 = iVar18 * 2;
        pnVar12 = (nh_menuitem_conflict *)realloc(pnVar12,(long)iVar18 * 0x10c);
      }
      uVar30 = uVar30 & 0xffffffff;
      pnVar12[uVar30].accel = '\0';
      pnVar12[uVar30].group_accel = '\0';
      pnVar12[uVar30].selected = '\0';
      uVar20 = iVar26 + 1;
      pnVar12[uVar30].caption[0] = '\0';
      pnVar12[uVar30].id = L'\0';
      pnVar12[uVar30].role = MI_TEXT;
      if (iVar18 <= (int)uVar20) {
        iVar18 = iVar18 * 2;
        pnVar12 = (nh_menuitem_conflict *)realloc(pnVar12,(long)iVar18 * 0x10c);
      }
      pnVar12[uVar20].id = L'\xffffffff';
      pnVar12[uVar20].role = MI_NORMAL;
      pnVar12[uVar20].accel = '!';
      pnVar12[uVar20].group_accel = '\0';
      pnVar12[uVar20].selected = '\0';
      builtin_strncpy(pnVar12[uVar20].caption,"add a ne",8);
      builtin_strncpy(pnVar12[uVar20].caption + 7,"ew rule",8);
      uVar20 = iVar26 + 2;
      if (iVar18 <= (int)uVar20) {
        iVar18 = iVar18 * 2;
        pnVar12 = (nh_menuitem_conflict *)realloc(pnVar12,(long)iVar18 * 0x10c);
      }
      pnVar12[uVar20].id = L'\xfffffffe';
      pnVar12[uVar20].role = MI_NORMAL;
      pnVar12[uVar20].accel = '?';
      pnVar12[uVar20].group_accel = '\0';
      pnVar12[uVar20].selected = '\0';
      pnVar12[uVar20].caption[4] = '\0';
      builtin_strncpy(pnVar12[uVar20].caption,"help",4);
      local_1ef8 = pnVar12;
      if (local_1efc == L'\xffffffff') {
        wVar6 = curses_display_menu_bottom
                          (pnVar12,iVar26 + L'\x03',"Autopickup rules:",L'\x01',&local_1efc);
      }
      else {
        wVar6 = curses_display_menu(pnVar12,iVar26 + L'\x03',"Autopickup rules:",L'\x01',&local_1efc
                                   );
      }
      pcVar21 = local_1ee8;
      if (wVar6 < L'\x01') {
        nh_set_option(local_1ef0->name,local_1ee8,0);
        free(*(void **)pcVar21);
        free(pcVar21);
        free(local_1ef8);
        return '\0';
      }
      pnVar12 = (nh_menuitem_conflict *)(long)local_1efc;
      if (pnVar12 != (nh_menuitem_conflict *)0xfffffffffffffffe) {
        if (local_1efc == L'\xffffffff') {
          uVar20 = *(uint *)((long)local_1ee8 + 8);
          uVar19 = uVar20 + 1;
          pnVar12 = (nh_menuitem_conflict *)(ulong)uVar19;
          *(uint *)((long)local_1ee8 + 8) = uVar19;
          pvVar10 = realloc(*(void **)local_1ee8,(long)(int)(uVar19 * 0x34));
          *(void **)pcVar21 = pvVar10;
          local_1ea8 = (undefined1 *)(long)(int)uVar20;
          lVar29 = (long)local_1ea8 * 0x34;
          *(undefined1 *)((long)pvVar10 + lVar29) = 0;
          *(undefined8 *)((long)pvVar10 + lVar29 + 0x28) = 0x400000061;
          *(undefined4 *)((long)pvVar10 + lVar29 + 0x30) = 0;
          local_1ec0 = (ulong)uVar20;
        }
        else {
          local_1ea8 = &pnVar12[-1].field_0x10b;
          pvVar10 = *(void **)local_1ee8;
          local_1ec0 = (ulong)local_1ea8 & 0xffffffff;
        }
        local_1e88 = (long)local_1ea8 * 0x34;
        pcVar21 = (char *)((long)pvVar10 + local_1e88);
        local_1ee0 = (nh_menuitem_conflict *)malloc(0x754);
        local_1e98 = local_1ee0->caption;
        local_1ec8 = local_1ee0[1].caption;
        local_1eb8 = local_1ee0[2].caption;
        local_1ea0 = local_1ee0[3].caption;
        local_1e70 = local_1ee0[4].caption;
        local_1e78 = local_1ee0 + 5;
        local_1e80 = local_1ee0[6].caption;
        local_1eb0 = pnVar12;
        do {
          sprintf(local_1c68,"rule position:\t[%d]",(ulong)pnVar12 & 0xffffffff);
          pnVar12 = local_1ee0;
          pnVar12->id = L'\x01';
          pnVar12->role = MI_NORMAL;
          pnVar12->accel = '\0';
          pnVar12->group_accel = '\0';
          local_1ee0->selected = '\0';
          strcpy(local_1e98,local_1c68);
          sprintf(local_1c68,"name pattern:\t[%s]",pcVar21);
          pnVar12[1].id = L'\x02';
          pnVar12[1].role = MI_NORMAL;
          pnVar12[1].accel = '\0';
          pnVar12[1].group_accel = '\0';
          pnVar12[1].selected = '\0';
          strcpy(local_1ec8,local_1c68);
          uVar30 = (ulong)(local_1ef0->field_4).e.numchoices;
          if ((long)uVar30 < 1) {
            pcVar27 = (char *)0x0;
          }
          else {
            ppcVar16 = &((local_1ef0->field_4).e.choices)->caption;
            uVar32 = 1;
            do {
              if (((nh_listitem *)(ppcVar16 + -1))->id == *(int *)(pcVar21 + 0x28)) {
                pcVar27 = *ppcVar16;
              }
              else {
                pcVar27 = (char *)0x0;
              }
              if (uVar30 <= uVar32) break;
              uVar32 = uVar32 + 1;
              ppcVar16 = ppcVar16 + 2;
            } while (pcVar27 == (char *)0x0);
          }
          sprintf(local_1c68,"object type:\t[%s]",pcVar27);
          pnVar12 = local_1ee0;
          pnVar12[2].id = L'\x03';
          pnVar12[2].role = MI_NORMAL;
          pnVar12[2].accel = '\0';
          pnVar12[2].group_accel = '\0';
          local_1ee0[2].selected = '\0';
          strcpy(local_1eb8,local_1c68);
          sprintf(local_1c68,"beatitude:\t[%s]",bucnames[*(uint *)(pcVar21 + 0x2c)]);
          pnVar12[3].id = L'\x04';
          pnVar12[3].role = MI_NORMAL;
          pnVar12[3].accel = '\0';
          pnVar12[3].group_accel = '\0';
          pnVar12[3].selected = '\0';
          strcpy(local_1ea0,local_1c68);
          pcVar27 = "LEAVE";
          if (*(int *)(pcVar21 + 0x30) == 0) {
            pcVar27 = "GRAB";
          }
          sprintf(local_1c68,"action:\t[%s]",pcVar27);
          pnVar12[4].id = L'\x05';
          pnVar12[4].role = MI_NORMAL;
          pnVar12[4].accel = '\0';
          pnVar12[4].group_accel = '\0';
          pnVar12[4].selected = '\0';
          strcpy(local_1e70,local_1c68);
          pnVar12[5].accel = '\0';
          pnVar12[5].group_accel = '\0';
          pnVar12[5].selected = '\0';
          local_1e78->caption[0] = '\0';
          local_1e78->id = L'\0';
          local_1e78->role = MI_TEXT;
          pnVar12[6].id = L'\x06';
          pnVar12[6].role = MI_NORMAL;
          pnVar12[6].accel = 'x';
          pnVar12[6].group_accel = '\0';
          pnVar12[6].selected = '\0';
          builtin_strncpy(local_1e80,"delete this rule",0x11);
          wVar6 = curses_display_menu(pnVar12,L'\a',"Edit rule:",L'\x01',&local_1ed8);
          pnVar12 = local_1eb0;
          pcVar27 = local_1ee8;
          if (wVar6 < L'\x01') goto LAB_0011113c;
          switch(local_1ed8) {
          case L'\x01':
            uVar20 = *(uint *)((long)local_1ee8 + 8);
            sprintf((char *)&local_1e68,"New rule position: (1 - %d), currently: %d",(ulong)uVar20,
                    (ulong)local_1eb0 & 0xffffffff);
            local_1c68[0] = '\0';
            curses_getline((char *)&local_1e68,local_1c68);
            if ((local_1c68[0] != '\0') && (local_1c68[0] != '\x1b')) {
              uVar19 = atoi(local_1c68);
              if ((int)uVar19 < 1 || (int)uVar20 < (int)uVar19) {
                curses_msgwin("Invalid rule position.");
              }
              else {
                uVar20 = uVar19 - 1;
                if (uVar20 != (uint)local_1ec0) {
                  lVar29 = *(long *)local_1ee8;
                  local_1a68[0].caption._40_4_ = *(undefined4 *)(lVar29 + 0x30 + local_1e88);
                  local_1a68[0]._0_8_ = *(undefined8 *)(lVar29 + local_1e88);
                  local_1a68[0].caption._0_8_ = ((undefined8 *)(lVar29 + local_1e88))[1];
                  pcVar21 = (char *)(lVar29 + 0x10 + local_1e88);
                  local_1a68[0].caption._8_8_ = *(undefined8 *)pcVar21;
                  local_1a68[0].caption._16_8_ = *(undefined8 *)(pcVar21 + 8);
                  pcVar21 = (char *)(lVar29 + 0x20 + local_1e88);
                  local_1a68[0].caption._24_8_ = *(undefined8 *)pcVar21;
                  local_1a68[0].caption._32_8_ = *(undefined8 *)(pcVar21 + 8);
                  if ((int)(uint)local_1ec0 < (int)uVar20) {
                    lVar33 = (ulong)uVar20 - (long)local_1ea8;
                    puVar23 = (undefined8 *)(local_1e88 + lVar29);
                    do {
                      *(undefined4 *)(puVar23 + 6) = *(undefined4 *)((long)puVar23 + 100);
                      puVar23[4] = *(undefined8 *)((long)puVar23 + 0x54);
                      puVar23[5] = *(undefined8 *)((long)puVar23 + 0x5c);
                      puVar23[2] = *(undefined8 *)((long)puVar23 + 0x44);
                      puVar23[3] = *(undefined8 *)((long)puVar23 + 0x4c);
                      *puVar23 = *(undefined8 *)((long)puVar23 + 0x34);
                      puVar23[1] = *(undefined8 *)((long)puVar23 + 0x3c);
                      puVar23 = (undefined8 *)((long)puVar23 + 0x34);
                      lVar33 = lVar33 + -1;
                    } while (lVar33 != 0);
                  }
                  else if (uVar19 <= (uint)local_1ec0) {
                    lVar33 = (long)local_1ea8 + 1;
                    puVar23 = (undefined8 *)(local_1e88 + lVar29);
                    do {
                      *(undefined4 *)(puVar23 + 6) = *(undefined4 *)((long)puVar23 + -4);
                      puVar23[4] = *(undefined8 *)((long)puVar23 + -0x14);
                      puVar23[5] = *(undefined8 *)((long)puVar23 + -0xc);
                      puVar23[2] = *(undefined8 *)((long)puVar23 + -0x24);
                      puVar23[3] = *(undefined8 *)((long)puVar23 + -0x1c);
                      *puVar23 = *(undefined8 *)((long)puVar23 + -0x34);
                      puVar23[1] = *(undefined8 *)((long)puVar23 + -0x2c);
                      puVar23 = (undefined8 *)((long)puVar23 + -0x34);
                      lVar33 = lVar33 + -1;
                    } while ((long)(ulong)uVar19 < lVar33);
                  }
                  lVar33 = (ulong)uVar20 * 0x34;
                  *(undefined4 *)(lVar29 + 0x30 + lVar33) = local_1a68[0].caption._40_4_;
                  pcVar21 = (char *)(lVar29 + 0x20 + lVar33);
                  *(undefined8 *)pcVar21 = local_1a68[0].caption._24_8_;
                  *(undefined8 *)(pcVar21 + 8) = local_1a68[0].caption._32_8_;
                  pcVar21 = (char *)(lVar29 + 0x10 + lVar33);
                  *(undefined8 *)pcVar21 = local_1a68[0].caption._8_8_;
                  *(undefined8 *)(pcVar21 + 8) = local_1a68[0].caption._16_8_;
                  *(undefined8 *)(lVar29 + lVar33) = local_1a68[0]._0_8_;
                  ((undefined8 *)(lVar29 + lVar33))[1] = local_1a68[0].caption._0_8_;
                  goto LAB_0011113c;
                }
              }
            }
            break;
          case L'\x02':
            builtin_strncpy(acStack_1e60 + 0x18,"everything):",0xd);
            builtin_strncpy(acStack_1e60 + 8," (empty matches ",0x10);
            local_1e68._0_1_ = 'N';
            local_1e68._1_1_ = 'e';
            local_1e68._2_1_ = 'w';
            local_1e68._3_1_ = ' ';
            local_1e68._4_1_ = 'n';
            local_1e68._5_1_ = 'a';
            local_1e68._6_1_ = 'm';
            local_1e68._7_1_ = 'e';
            builtin_strncpy(acStack_1e60," pattern",8);
            local_1c68[0] = '\0';
            curses_getline((char *)&local_1e68,local_1c68);
            if (local_1c68[0] != '\x1b') {
              strncpy(pcVar21,local_1c68,0x28);
            }
            pcVar21[0x27] = '\0';
            break;
          case L'\x03':
            local_1e8c = *(wchar_t *)(pcVar21 + 0x28);
            uVar30 = (ulong)(local_1ef0->field_4).e.numchoices;
            pnVar13 = (nh_menuitem_conflict *)malloc(uVar30 * 0x10c);
            if ((long)uVar30 < 1) {
              lVar29 = 0;
            }
            else {
              lVar33 = 8;
              lVar34 = 0x10a;
              lVar29 = 0;
              do {
                if ((int)uVar30 <= lVar29) {
                  uVar20 = (int)uVar30 * 2;
                  uVar30 = (ulong)uVar20;
                  pnVar13 = (nh_menuitem_conflict *)realloc(pnVar13,(long)(int)uVar20 * 0x10c);
                }
                pnVar31 = local_1ef0;
                pnVar2 = (local_1ef0->field_4).e.choices;
                uVar1 = *(undefined4 *)((long)pnVar2 + lVar33 + -8);
                *(undefined4 *)((long)pnVar13 + lVar34 + -0x10a) = uVar1;
                *(undefined4 *)((long)pnVar13 + lVar34 + -0x106) = 1;
                pnVar13->caption[lVar34 + -10] = (char)uVar1;
                (pnVar13->caption + lVar34 + -9)[0] = '\0';
                (pnVar13->caption + lVar34 + -9)[1] = '\0';
                strcpy((char *)((long)pnVar13 + lVar34 + -0x102),
                       *(char **)((long)&pnVar2->id + lVar33));
                lVar29 = lVar29 + 1;
                lVar33 = lVar33 + 0x10;
                lVar34 = lVar34 + 0x10c;
                pnVar12 = local_1eb0;
              } while (lVar29 < (pnVar31->field_4).e.numchoices);
            }
            wVar5 = curses_display_menu(pnVar13,(wchar_t)lVar29,"Object class match:",L'\x01',
                                        &local_1a68[0].id);
            free(pnVar13);
            wVar6 = local_1e8c;
            if (L'\0' < wVar5) {
              wVar6 = local_1a68[0].id;
            }
            *(wchar_t *)(pcVar21 + 0x28) = wVar6;
            break;
          case L'\x04':
            iVar26 = *(int *)(pcVar21 + 0x2c);
            memcpy(local_1a68,&DAT_0011cff0,0x53c);
            wVar6 = curses_display_menu(local_1a68,L'\x05',"Beatitude match:",L'\x01',&local_1ed4);
            iVar14 = local_1ed4 + L'\xffffffff';
            if (wVar6 < L'\x01') {
              iVar14 = iVar26;
            }
            *(int *)(pcVar21 + 0x2c) = iVar14;
            break;
          case L'\x05':
            if (*(int *)(pcVar21 + 0x30) == 0) {
              pcVar21[0x30] = '\x01';
              pcVar21[0x31] = '\0';
              pcVar21[0x32] = '\0';
              pcVar21[0x33] = '\0';
            }
            else {
              pcVar21[0x30] = '\0';
              pcVar21[0x31] = '\0';
              pcVar21[0x32] = '\0';
              pcVar21[0x33] = '\0';
            }
            break;
          case L'\x06':
            goto switchD_00110daa_caseD_6;
          }
        } while( true );
      }
      memcpy(local_1a68,&DAT_0011b5c0,0x1a2c);
      curses_display_menu(local_1a68,L'\x19',"Autopickup rules help:",L'\0',(wchar_t *)0x0);
      pnVar12 = local_1ef8;
    } while( true );
  case 5:
    plVar9 = (long *)malloc(0x10);
    pnVar3 = (pnVar31->value).ar;
    if (pnVar3 == (nh_autopickup_rules *)0x0) {
      *(undefined4 *)(plVar9 + 1) = 0;
      *plVar9 = 0;
      iVar18 = 4;
    }
    else {
      iVar18 = pnVar3->num_rules;
      *(int *)(plVar9 + 1) = iVar18;
      pvVar10 = malloc((ulong)(uint)(iVar18 * 0x7c));
      *plVar9 = (long)pvVar10;
      memcpy(pvVar10,pnVar3->rules,(ulong)(uint)(iVar18 * 0x7c));
      iVar18 = iVar18 + 4;
    }
    pnVar12 = (nh_menuitem_conflict *)malloc((long)iVar18 * 0x10c);
    local_1efc = L'\0';
    do {
      while( true ) {
        while( true ) {
          if (iVar18 < 1) {
            iVar18 = iVar18 * 2;
            pnVar12 = (nh_menuitem_conflict *)realloc(pnVar12,(long)iVar18 * 0x10c);
          }
          pnVar12->id = L'\0';
          pnVar12->role = MI_HEADING;
          pnVar12->accel = '\0';
          pnVar12->group_accel = '\0';
          pnVar12->selected = '\0';
          builtin_strncpy(pnVar12->caption,"Pos\tAction\tPattern",0x13);
          if ((int)plVar9[1] < 1) {
            uVar30 = 1;
          }
          else {
            lVar33 = 0x216;
            lVar29 = 0;
            uVar32 = 1;
            do {
              uVar20 = *(uint *)(*plVar9 + 0x78 + lVar29);
              if ((ulong)uVar20 < 3) {
                pcVar21 = (&PTR_anon_var_dwarf_af5c_00124b18)[uVar20];
              }
              else {
                pcVar21 = "(invalid)";
                if (uVar20 == 3) {
                  pcVar21 = "HIDE";
                }
              }
              sprintf((char *)local_1a68,"%2d.\t%s\t%s",uVar32 & 0xffffffff,pcVar21,*plVar9 + lVar29
                     );
              if ((long)iVar18 <= (long)uVar32) {
                iVar18 = iVar18 * 2;
                pnVar12 = (nh_menuitem_conflict *)realloc(pnVar12,(long)iVar18 * 0x10c);
              }
              pcVar21 = pnVar12->caption + lVar33 + -8;
              *(int *)(pcVar21 + -0x10a) = (int)uVar32;
              *(undefined4 *)(pcVar21 + -0x106) = 1;
              *(undefined2 *)(pcVar21 + -2) = MI_TEXT >> 0x10;
              *pcVar21 = '\0';
              strcpy(pcVar21 + -0x102,(char *)local_1a68);
              uVar30 = uVar32 + 1;
              lVar29 = lVar29 + 0x7c;
              lVar33 = lVar33 + 0x10c;
              bVar35 = (long)uVar32 < (long)(int)plVar9[1];
              uVar32 = uVar30;
            } while (bVar35);
          }
          iVar26 = (int)uVar30;
          if (iVar18 <= iVar26) {
            iVar18 = iVar18 * 2;
            pnVar12 = (nh_menuitem_conflict *)realloc(pnVar12,(long)iVar18 * 0x10c);
          }
          uVar30 = uVar30 & 0xffffffff;
          pnVar12[uVar30].accel = '\0';
          pnVar12[uVar30].group_accel = '\0';
          pnVar12[uVar30].selected = '\0';
          uVar20 = iVar26 + 1;
          pnVar12[uVar30].caption[0] = '\0';
          pnVar12[uVar30].id = L'\0';
          pnVar12[uVar30].role = MI_TEXT;
          if (iVar18 <= (int)uVar20) {
            iVar18 = iVar18 * 2;
            pnVar12 = (nh_menuitem_conflict *)realloc(pnVar12,(long)iVar18 * 0x10c);
          }
          pnVar12[uVar20].id = L'\xffffffff';
          pnVar12[uVar20].role = MI_NORMAL;
          pnVar12[uVar20].accel = '+';
          pnVar12[uVar20].group_accel = '\0';
          pnVar12[uVar20].selected = '\0';
          builtin_strncpy(pnVar12[uVar20].caption,"add new ",8);
          builtin_strncpy(pnVar12[uVar20].caption + 6,"w match",8);
          uVar20 = iVar26 + 2;
          if (iVar18 <= (int)uVar20) {
            iVar18 = iVar18 * 2;
            pnVar12 = (nh_menuitem_conflict *)realloc(pnVar12,(long)iVar18 * 0x10c);
          }
          pnVar12[uVar20].id = L'\xfffffffe';
          pnVar12[uVar20].role = MI_NORMAL;
          pnVar12[uVar20].accel = '?';
          pnVar12[uVar20].group_accel = '\0';
          pnVar12[uVar20].selected = '\0';
          pnVar12[uVar20].caption[4] = '\0';
          builtin_strncpy(pnVar12[uVar20].caption,"help",4);
          if (local_1efc == L'\xffffffff') {
            wVar6 = curses_display_menu_bottom
                              (pnVar12,iVar26 + L'\x03',"Message types:",L'\x01',&local_1efc);
          }
          else {
            wVar6 = curses_display_menu(pnVar12,iVar26 + L'\x03',"Message types:",L'\x01',
                                        &local_1efc);
          }
          wVar5 = local_1efc;
          if (wVar6 < L'\x01') {
            nh_set_option(local_1ef0->name,plVar9,0);
            if ((void *)*plVar9 != (void *)0x0) {
              free((void *)*plVar9);
            }
            free(plVar9);
            free(pnVar12);
            return '\0';
          }
          uVar30 = (ulong)(uint)local_1efc;
          if (local_1efc != L'\xffffffff') break;
          iVar26 = (int)plVar9[1];
          if ((long)iVar26 < 1000) {
            *(int *)(plVar9 + 1) = iVar26 + 1;
            pvVar10 = realloc((void *)*plVar9,(ulong)(uint)((iVar26 + 1) * 0x7c));
            *plVar9 = (long)pvVar10;
            lVar29 = (long)iVar26 * 0x7c;
            *(undefined1 *)((long)pvVar10 + lVar29) = 0;
            *(undefined4 *)((long)pvVar10 + lVar29 + 0x78) = 0;
          }
          else {
            curses_msgwin("Maximum number of rules reached.");
          }
        }
        if (local_1efc != L'\xfffffffe') break;
        memcpy(local_1a68,&DAT_0011d530,0x10c0);
        curses_display_menu(local_1a68,L'\x10',"Message types help:",L'\0',(wchar_t *)0x0);
      }
      local_1eb8 = (char *)*plVar9;
      local_1ea0 = (char *)CONCAT44(local_1ea0._4_4_,local_1efc + L'\xffffffff');
      local_1ec8 = (char *)(long)(local_1efc + L'\xffffffff');
      pcVar21 = local_1eb8 + (long)local_1ec8 * 0x7c;
      pnVar13 = (nh_menuitem_conflict *)malloc(0x53c);
      local_1ef8 = (nh_menuitem_conflict *)pnVar13->caption;
      local_1ee0 = (nh_menuitem_conflict *)pnVar13[1].caption;
      local_1ee8 = pnVar13[2].caption;
      local_1eb0 = pnVar13 + 3;
      local_1e98 = pnVar13[4].caption;
LAB_00111677:
      sprintf((char *)&local_1e68,"Position:\t[%d]",uVar30);
      pnVar13->id = L'\x01';
      pnVar13->role = MI_NORMAL;
      pnVar13->accel = '\0';
      pnVar13->group_accel = '\0';
      pnVar13->selected = '\0';
      strcpy((char *)local_1ef8,(char *)&local_1e68);
      wVar6 = *(wchar_t *)(pcVar21 + 0x78);
      if ((ulong)(uint)wVar6 < 3) {
        pcVar27 = (&PTR_anon_var_dwarf_af5c_00124b18)[(uint)wVar6];
      }
      else {
        pcVar27 = "(invalid)";
        if (wVar6 == L'\x03') {
          pcVar27 = "HIDE";
        }
      }
      sprintf((char *)&local_1e68,"Action:\t[%s]",pcVar27);
      pnVar13[1].id = L'\x02';
      pnVar13[1].role = MI_NORMAL;
      pnVar13[1].accel = '\0';
      pnVar13[1].group_accel = '\0';
      pnVar13[1].selected = '\0';
      strcpy((char *)local_1ee0,(char *)&local_1e68);
      sprintf((char *)&local_1e68,"Pattern:\t[%s]",pcVar21);
      pnVar13[2].id = L'\x03';
      pnVar13[2].role = MI_NORMAL;
      pnVar13[2].accel = '\0';
      pnVar13[2].group_accel = '\0';
      pnVar13[2].selected = '\0';
      strcpy(local_1ee8,(char *)&local_1e68);
      pnVar13[3].accel = '\0';
      pnVar13[3].group_accel = '\0';
      pnVar13[3].selected = '\0';
      local_1eb0->caption[0] = '\0';
      local_1eb0->id = L'\0';
      local_1eb0->role = MI_TEXT;
      pnVar13[4].id = L'\x04';
      pnVar13[4].role = MI_NORMAL;
      pnVar13[4].accel = '!';
      pnVar13[4].group_accel = '\0';
      pnVar13[4].selected = '\0';
      builtin_strncpy(local_1e98,"Delete this match",0x12);
      wVar6 = curses_display_menu(pnVar13,L'\x05',"Edit match:",L'\x01',&local_1ed8);
      if (wVar6 < L'\x01') goto LAB_00111a9c;
      switch(local_1ed8) {
      case L'\x01':
        wVar6 = *(wchar_t *)(plVar9 + 1);
        sprintf(local_1c68,"New match position: (1 - %d, currently %d)",(ulong)(uint)wVar6,uVar30);
        local_1e68 = local_1e68 & 0xffffffffffffff00;
        curses_getline(local_1c68,(char *)&local_1e68);
        if (((char)local_1e68 == '\0') || ((char)local_1e68 == '\x1b')) goto LAB_00111677;
        wVar7 = atoi((char *)&local_1e68);
        if (wVar7 < L'\x01' || wVar6 < wVar7) {
          pcVar27 = "Invalid match position.";
          goto LAB_00111963;
        }
        if (wVar7 == wVar5) goto LAB_00111677;
        pcVar27 = pcVar21;
        pnVar25 = local_1a68;
        for (lVar29 = 0x1f; lVar29 != 0; lVar29 = lVar29 + -1) {
          pnVar25->id = *(wchar_t *)pcVar27;
          pcVar27 = pcVar27 + (ulong)bVar36 * -8 + 4;
          pnVar25 = (nh_menuitem_conflict *)((long)pnVar25 + (ulong)bVar36 * -8 + 4);
        }
        if (wVar5 < wVar7) {
          lVar29 = (ulong)(uint)(wVar7 + L'\xffffffff') - (long)local_1ec8;
          do {
            pcVar27 = pcVar21 + 0x7c;
            pcVar24 = pcVar21;
            for (lVar33 = 0x1f; lVar33 != 0; lVar33 = lVar33 + -1) {
              *(wchar_t *)pcVar24 = *(wchar_t *)pcVar27;
              pcVar27 = pcVar27 + (ulong)bVar36 * -8 + 4;
              pcVar24 = pcVar24 + (ulong)bVar36 * -8 + 4;
            }
            lVar29 = lVar29 + -1;
            pcVar21 = pcVar21 + 0x7c;
          } while (lVar29 != 0);
        }
        else if ((uint)wVar7 <= (uint)(wchar_t)local_1ea0) {
          pcVar27 = local_1ec8 + 1;
          do {
            pcVar24 = pcVar21 + -0x7c;
            pcVar28 = pcVar21;
            for (lVar29 = 0x1f; lVar29 != 0; lVar29 = lVar29 + -1) {
              *(wchar_t *)pcVar28 = *(wchar_t *)pcVar24;
              pcVar24 = pcVar24 + (ulong)bVar36 * -8 + 4;
              pcVar28 = pcVar28 + (ulong)bVar36 * -8 + 4;
            }
            pcVar27 = pcVar27 + -1;
            pcVar21 = pcVar21 + -0x7c;
          } while ((long)(ulong)(uint)wVar7 < (long)pcVar27);
        }
        pnVar25 = local_1a68;
        pcVar21 = local_1eb8 + (ulong)(uint)(wVar7 + L'\xffffffff') * 0x7c;
        for (lVar29 = 0x1f; lVar29 != 0; lVar29 = lVar29 + -1) {
          *(wchar_t *)pcVar21 = pnVar25->id;
          pnVar25 = (nh_menuitem_conflict *)((long)pnVar25 + (ulong)bVar36 * -8 + 4);
          pcVar21 = pcVar21 + (ulong)bVar36 * -8 + 4;
        }
LAB_00111a9c:
        free(pnVar13);
        break;
      case L'\x02':
        wVar6 = *(wchar_t *)(pcVar21 + 0x78);
        memcpy(local_1a68,&DAT_0011e5f0,0x430);
        if ((ulong)(uint)wVar6 < 3) {
          pcVar27 = (&PTR_anon_var_dwarf_af5c_00124b18)[(uint)wVar6];
        }
        else {
          pcVar27 = "(invalid)";
          if (wVar6 == L'\x03') {
            pcVar27 = "HIDE";
          }
        }
        sprintf(local_1d68,"Message type action: (currently %s)",pcVar27);
        wVar8 = curses_display_menu(local_1a68,L'\x04',local_1d68,L'\x01',&local_1ed4);
        wVar7 = local_1ed4 + L'\xffffffff';
        if (wVar8 < L'\x01') {
          wVar7 = wVar6;
        }
        *(wchar_t *)(pcVar21 + 0x78) = wVar7;
        goto LAB_00111677;
      case L'\x03':
        snprintf(local_1c68,0x100,"New match pattern: (currently \"%s\")",pcVar21);
        local_1e68 = local_1e68 & 0xffffffffffffff00;
        curses_getline(local_1c68,(char *)&local_1e68);
        if ((char)local_1e68 != '\x1b') {
          lVar29 = 0;
          do {
            cVar4 = *(char *)((long)&local_1e68 + lVar29);
            if (((cVar4 == '\"') || (cVar4 == '|')) || (cVar4 == ';')) {
              *(undefined1 *)((long)&local_1e68 + lVar29) = 0x3f;
            }
            lVar29 = lVar29 + 1;
          } while (lVar29 != 0x100);
          strncpy(pcVar21,(char *)&local_1e68,0x78);
        }
        pcVar21[0x77] = '\0';
        goto LAB_00111677;
      case L'\x04':
        lVar29 = (long)*(wchar_t *)(plVar9 + 1) + -1;
        pcVar27 = local_1ec8;
        if (wVar5 < *(wchar_t *)(plVar9 + 1)) {
          do {
            pcVar27 = pcVar27 + 1;
            pcVar24 = pcVar21 + 0x7c;
            pcVar28 = pcVar21;
            for (lVar33 = 0x1f; lVar33 != 0; lVar33 = lVar33 + -1) {
              *(wchar_t *)pcVar28 = *(wchar_t *)pcVar24;
              pcVar24 = pcVar24 + (ulong)bVar36 * -8 + 4;
              pcVar28 = pcVar28 + (ulong)bVar36 * -8 + 4;
            }
            pcVar21 = pcVar21 + 0x7c;
          } while ((long)pcVar27 < lVar29);
        }
        *(int *)(plVar9 + 1) = (int)lVar29;
        pvVar10 = realloc(local_1eb8,lVar29 * 0x7c);
        *plVar9 = (long)pvVar10;
        goto LAB_00111a9c;
      default:
        pcVar27 = "Invalid msgtype match menu choice.";
LAB_00111963:
        curses_msgwin(pcVar27);
        goto LAB_00111677;
      }
    } while( true );
  }
  cVar4 = nh_set_option(pnVar31->name,local_1ed0,0);
  if (cVar4 == '\0') {
    sprintf(local_1b68,"new value for %s rejected",pnVar31->name);
    curses_msgwin(local_1b68);
  }
  else {
    print_option_string(pnVar31,mdat->items->caption + (long)local_1ef8);
  }
  return settings.optstyle != iVar18;
switchD_00110daa_caseD_6:
  lVar29 = (long)(int)*(long *)((long)local_1ee8 + 8) + -1;
  iVar26 = (int)lVar29;
  if ((int)(uint)local_1ec0 < iVar26) {
    pvVar10 = *(void **)local_1ee8;
    puVar23 = (undefined8 *)(local_1e88 + (long)pvVar10);
    puVar17 = local_1ea8;
    do {
      puVar17 = puVar17 + 1;
      *(undefined4 *)(puVar23 + 6) = *(undefined4 *)((long)puVar23 + 100);
      puVar23[4] = *(undefined8 *)((long)puVar23 + 0x54);
      puVar23[5] = *(undefined8 *)((long)puVar23 + 0x5c);
      puVar23[2] = *(undefined8 *)((long)puVar23 + 0x44);
      puVar23[3] = *(undefined8 *)((long)puVar23 + 0x4c);
      *puVar23 = *(undefined8 *)((long)puVar23 + 0x34);
      puVar23[1] = *(undefined8 *)((long)puVar23 + 0x3c);
      puVar23 = (undefined8 *)((long)puVar23 + 0x34);
    } while ((long)puVar17 < lVar29);
  }
  else {
    lVar29 = (long)iVar26;
    pvVar10 = *(void **)local_1ee8;
  }
  *(int *)((long)local_1ee8 + 8) = iVar26;
  pvVar10 = realloc(pvVar10,lVar29 * 0x34);
  *(void **)pcVar27 = pvVar10;
LAB_0011113c:
  free(local_1ee0);
  pnVar12 = local_1ef8;
  goto LAB_00110627;
}

Assistant:

static nh_bool get_option_value(struct win_menu *mdat, int idx)
{
    char buf[BUFSZ], query[BUFSZ];
    union nh_optvalue value;
    struct nh_option_desc *option, *optlist;
    int listid = mdat->items[idx].id >> 10;
    int id = mdat->items[idx].id & 0x1ff;
    char strbuf[BUFSZ];
    int prev_optstyle = settings.optstyle;
    
    switch (listid) {
	case ACT_BIRTH_OPTS:
	    optlist = nh_get_options(ACTIVE_BIRTH_OPTIONS); break;
	case CUR_BIRTH_OPTS:
	    optlist = nh_get_options(CURRENT_BIRTH_OPTIONS); break;
	case GAME_OPTS:
	    optlist = nh_get_options(GAME_OPTIONS); break;
	case UI_OPTS:
	    optlist = curses_options; break;
	    
	default:
	    return FALSE;
    }
    
    option = &optlist[id];
    value.s = strbuf;
    
    switch ((int)option->type) {
	case OPTTYPE_BOOL:
	    select_boolean_value(&value, option);
	    break;
	    
	case OPTTYPE_INT:
	    sprintf(query, "New value for %s (number from %d to %d)",
		    option->name, option->i.min, option->i.max);
	    sprintf(buf, "%d", value.i);
	    curses_getline(query, buf);
	    if (buf[0] == '\033')
		return FALSE;
	    sscanf(buf, "%d", &value.i);
	    break;
	    
	case OPTTYPE_ENUM:
	    select_enum_value(&value, option);
	    break;
	    
	case OPTTYPE_STRING:
	    sprintf(query, "New value for %s (text)", option->name);
	    curses_getline(query, value.s);
	    if (value.s[0] == '\033')
		return FALSE;
	    break;
	    
	case OPTTYPE_AUTOPICKUP_RULES:
	    show_autopickup_menu(option);
	    return FALSE;
	    
	case OPTTYPE_MSGTYPE:
	    show_msgtype_menu(option);
	    return FALSE;
	    
	case OPTTYPE_KEYMAP:
	    show_keymap_menu(FALSE);
	    return FALSE;
	    
	default:
	    return FALSE;
    }
    
    if (!nh_set_option(option->name, value, FALSE)) {
	sprintf(strbuf, "new value for %s rejected", option->name);
	curses_msgwin(strbuf);
    } else
	print_option_string(option, mdat->items[idx].caption);
    
    /* special case: directly redo option menu appearance */
    if (settings.optstyle != prev_optstyle)
	return TRUE;
    
    return FALSE;
}